

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlCrc32.cpp
# Opt level: O0

void __thiscall libebml::EbmlCrc32::EbmlCrc32(EbmlCrc32 *this)

{
  EbmlCrc32 *this_local;
  
  EbmlBinary::EbmlBinary(&this->super_EbmlBinary);
  (this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement =
       (_func_int **)&PTR__EbmlCrc32_00237240;
  ResetCRC(this);
  (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[0x10])(this,4);
  this->m_crc_final = 0;
  EbmlElement::SetSize_((EbmlElement *)this,4);
  return;
}

Assistant:

EbmlCrc32::EbmlCrc32()
{
  ResetCRC();
  SetDefaultSize(4);
  m_crc_final = 0;
  SetSize_(4);
  //This EbmlElement has been set
  //  SetValueIsSet();
}